

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O2

session_config * rudp::operator&=(session_config *l,session_config *r)

{
  undefined1 uVar1;
  byte bVar2;
  undefined2 uVar3;
  ushort uVar4;
  ushort uVar5;
  undefined2 uVar6;
  
  uVar3 = r->retransmission_timeout_value;
  uVar4 = l->retransmission_timeout_value;
  if ((ushort)uVar3 < uVar4) {
    uVar4 = uVar3;
  }
  uVar5 = l->null_segment_timeout_value;
  l->retransmission_timeout_value = uVar4;
  uVar4 = l->cumulative_ack_timeout_value;
  if (r->cumulative_ack_timeout_value < l->cumulative_ack_timeout_value) {
    uVar4 = r->cumulative_ack_timeout_value;
  }
  l->cumulative_ack_timeout_value = uVar4;
  uVar6 = r->null_segment_timeout_value;
  if ((ushort)uVar6 < uVar5) {
    uVar5 = uVar6;
  }
  l->null_segment_timeout_value = uVar5;
  uVar4 = l->transfer_state_timeout_value;
  if (r->transfer_state_timeout_value < l->transfer_state_timeout_value) {
    uVar4 = r->transfer_state_timeout_value;
  }
  l->transfer_state_timeout_value = uVar4;
  uVar1 = r->max_retrans;
  bVar2 = l->max_retrans;
  if ((byte)uVar1 < bVar2) {
    bVar2 = uVar1;
  }
  l->max_retrans = bVar2;
  bVar2 = l->max_cum_ack;
  if (r->max_cum_ack < l->max_cum_ack) {
    bVar2 = r->max_cum_ack;
  }
  l->max_cum_ack = bVar2;
  bVar2 = l->max_out_of_seq;
  if (r->max_out_of_seq < l->max_out_of_seq) {
    bVar2 = r->max_out_of_seq;
  }
  l->max_out_of_seq = bVar2;
  bVar2 = l->max_auto_reset;
  if (r->max_auto_reset < l->max_auto_reset) {
    bVar2 = r->max_auto_reset;
  }
  l->max_auto_reset = bVar2;
  return l;
}

Assistant:

session_config &operator&=( session_config &l, const session_config &r ) {
  l.retransmission_timeout_value = std::min( l.retransmission_timeout_value, r.retransmission_timeout_value );
  l.cumulative_ack_timeout_value = std::min( l.cumulative_ack_timeout_value, r.cumulative_ack_timeout_value );
  l.null_segment_timeout_value = std::min( l.null_segment_timeout_value, r.null_segment_timeout_value );
  l.transfer_state_timeout_value = std::min( l.transfer_state_timeout_value, r.transfer_state_timeout_value );
  l.max_retrans = std::min( l.max_retrans, r.max_retrans );
  l.max_cum_ack = std::min( l.max_cum_ack, r.max_cum_ack );
  l.max_out_of_seq = std::min( l.max_out_of_seq, r.max_out_of_seq );
  l.max_auto_reset = std::min( l.max_auto_reset, r.max_auto_reset );
  return l;
}